

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

bool tchecker::zg::shared_is_le(state_t *s1,state_t *s2)

{
  zone_t *this;
  zone_t *zone;
  bool bVar1;
  bool bVar2;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_38;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_30;
  
  bVar1 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  if (bVar1) {
    local_30._t = (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0;
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::reset(&local_30,(s1->_zone)._t);
    local_38._t = (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0;
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::reset(&local_38,(s2->_zone)._t);
    if (local_30._t == local_38._t) {
      bVar2 = true;
    }
    else {
      this = &((s1->_zone)._t)->super_zone_t;
      if ((this == (zone_t *)0x0) || (zone = &((s2->_zone)._t)->super_zone_t, zone == (zone_t *)0x0)
         ) {
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1d0,
                      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
                     );
      }
      bVar2 = zone_t::operator<=(this,zone);
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar1) {
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_38);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_30);
  }
  return bVar2;
}

Assistant:

bool shared_is_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone() <= s2.zone());
}